

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_part.c
# Opt level: O0

REF_STATUS ref_part_metric_solb(REF_NODE ref_node,char *filename)

{
  REF_FILEPOS RVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  __off_t _Var5;
  int local_6c4;
  int local_6c0;
  int local_6b8;
  REF_LONG ref_private_status_reis_bi_15;
  REF_LONG ref_private_status_reis_ai_15;
  REF_LONG ref_private_status_reis_bi_14;
  REF_LONG ref_private_status_reis_ai_14;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rxs_1;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rxs;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_LONG ref_private_status_reis_bi_13;
  REF_LONG ref_private_status_reis_ai_13;
  REF_LONG ref_private_status_reis_bi_12;
  REF_LONG ref_private_status_reis_ai_12;
  REF_LONG ref_private_status_reis_bi_11;
  REF_LONG ref_private_status_reis_ai_11;
  REF_LONG ref_private_status_reis_bi_10;
  REF_LONG ref_private_status_reis_ai_10;
  REF_LONG ref_private_status_reis_bi_9;
  REF_LONG ref_private_status_reis_ai_9;
  REF_LONG ref_private_status_reis_bi_8;
  REF_LONG ref_private_status_reis_ai_8;
  REF_LONG ref_private_status_reis_bi_7;
  REF_LONG ref_private_status_reis_ai_7;
  REF_LONG ref_private_status_reis_bi_6;
  REF_LONG ref_private_status_reis_ai_6;
  REF_LONG ref_private_status_reis_bi_5;
  REF_LONG ref_private_status_reis_ai_5;
  REF_INT ref_malloc_init_i;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_LONG ref_private_status_reis_bi_4;
  REF_LONG ref_private_status_reis_ai_4;
  REF_LONG ref_private_status_reis_bi_3;
  REF_LONG ref_private_status_reis_ai_3;
  REF_LONG ref_private_status_reis_bi_2;
  REF_LONG ref_private_status_reis_ai_2;
  REF_LONG ref_private_status_reis_bi_1;
  REF_LONG ref_private_status_reis_ai_1;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_LONG nnode;
  REF_GLOB global;
  REF_INT i;
  REF_INT ldim;
  REF_INT type;
  REF_INT ntype;
  REF_INT dim;
  REF_INT version;
  REF_BOOL available;
  REF_INT local;
  REF_INT node;
  REF_INT section_size;
  REF_LONG nnode_read;
  REF_DBL *metric;
  FILE *pFStack_520;
  REF_INT chunk;
  FILE *file;
  REF_FILEPOS key_pos [156];
  REF_FILEPOS local_30;
  REF_FILEPOS next_position;
  REF_MPI ref_mpi;
  char *filename_local;
  REF_NODE ref_node_local;
  
  next_position = (REF_FILEPOS)ref_node->ref_mpi;
  local_30 = -1;
  pFStack_520 = (FILE *)0x0;
  ref_mpi = (REF_MPI)filename;
  filename_local = (char *)ref_node;
  if (((REF_MPI)next_position)->id == 0) {
    uVar2 = ref_import_meshb_header(filename,&ntype,(REF_FILEPOS *)&file);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x722,
             "ref_part_metric_solb",(ulong)uVar2,"header");
      return uVar2;
    }
    if ((ntype < 2) || (4 < ntype)) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x723,
             "ref_part_metric_solb","unsupported version");
      return 1;
    }
    pFStack_520 = fopen((char *)ref_mpi,"r");
    if (pFStack_520 == (FILE *)0x0) {
      printf("unable to open %s\n",ref_mpi);
    }
    if (pFStack_520 == (FILE *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x726,
             "ref_part_metric_solb","unable to open file");
      return 2;
    }
    uVar2 = ref_import_meshb_jump((FILE *)pFStack_520,ntype,(REF_FILEPOS *)&file,3,&dim,&local_30);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x729,
             "ref_part_metric_solb",(ulong)uVar2,"jump");
      return uVar2;
    }
    if (dim == 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x72a,
             "ref_part_metric_solb","solb missing dimension");
      return 1;
    }
    sVar4 = fread(&type,4,1,pFStack_520);
    if (sVar4 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x72b,
             "ref_part_metric_solb","dim",1,sVar4);
      return 1;
    }
    if ((type < 2) || (3 < type)) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x72c,
             "ref_part_metric_solb","unsupported dimension");
      return 1;
    }
    uVar2 = ref_import_meshb_jump
                      ((FILE *)pFStack_520,ntype,(REF_FILEPOS *)&file,0x3e,&dim,&local_30);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x72f,
             "ref_part_metric_solb",(ulong)uVar2,"jump");
      return uVar2;
    }
    if (dim == 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x730,
             "ref_part_metric_solb","SolAtVertices missing");
      return 1;
    }
    uVar2 = ref_part_meshb_long((FILE *)pFStack_520,ntype,(REF_LONG *)&ref_private_macro_code_rss_1)
    ;
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x731,
             "ref_part_metric_solb",(ulong)uVar2,"nnode");
      return uVar2;
    }
    sVar4 = fread(&ldim,4,1,pFStack_520);
    if (sVar4 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x732,
             "ref_part_metric_solb","ntype",1,sVar4);
      return 1;
    }
    global._4_4_ = 0;
    for (global._0_4_ = 0; (int)global < ldim; global._0_4_ = (int)global + 1) {
      sVar4 = fread(&i,4,1,pFStack_520);
      if (sVar4 != 1) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               0x735,"ref_part_metric_solb","type",1,sVar4);
        return 1;
      }
      if ((i < 1) || (3 < i)) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               0x738,"ref_part_metric_solb","only types 1 (scalar) or 3 (tensor)) supported");
        printf(" %d type\n",(ulong)(uint)i);
        return 1;
      }
      if (i == 1) {
        global._4_4_ = global._4_4_ + 1;
      }
      if (i == 3) {
        if (type == 2) {
          global._4_4_ = global._4_4_ + 3;
        }
        else {
          global._4_4_ = global._4_4_ + 6;
        }
      }
    }
    if (type == 2) {
      if ((long)global._4_4_ != 3) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               0x743,"ref_part_metric_solb","2D expects 3 terms of 2x2 metric",3,(long)global._4_4_)
        ;
        return 1;
      }
    }
    else if ((long)global._4_4_ != 6) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x745,
             "ref_part_metric_solb","3D expects 6 terms of 3x3 metric",6,(long)global._4_4_);
      return 1;
    }
  }
  uVar2 = ref_mpi_bcast(*(REF_MPI *)(filename_local + 0x50),&ntype,1,1);
  if (uVar2 == 0) {
    uVar2 = ref_mpi_bcast(*(REF_MPI *)(filename_local + 0x50),&type,1,1);
    if (uVar2 == 0) {
      uVar2 = ref_mpi_bcast(*(REF_MPI *)(filename_local + 0x50),&ref_private_macro_code_rss_1,1,2);
      if (uVar2 == 0) {
        uVar2 = ref_mpi_bcast(*(REF_MPI *)(filename_local + 0x50),(void *)((long)&global + 4),1,2);
        if (uVar2 == 0) {
          if ((_ref_private_macro_code_rss_1 == *(long *)(filename_local + 0x68)) ||
             (_ref_private_macro_code_rss_1 / 2 == *(long *)(filename_local + 0x68))) {
            if (_ref_private_macro_code_rss_1 / (long)**(int **)(filename_local + 0x50) < 100000) {
              local_6b8 = 100000;
            }
            else {
              local_6b8 = (int)(_ref_private_macro_code_rss_1 /
                               (long)**(int **)(filename_local + 0x50));
            }
            if (local_6b8 < _ref_private_macro_code_rss_1) {
              local_6c0 = local_6b8;
            }
            else {
              local_6c0 = (int)_ref_private_macro_code_rss_1;
            }
            metric._4_4_ = local_6c0;
            if (local_6c0 * 6 < 0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                     ,0x75d,"ref_part_metric_solb","malloc metric of REF_DBL negative");
              ref_node_local._4_4_ = 1;
            }
            else {
              nnode_read = (REF_LONG)malloc((long)(local_6c0 * 6) << 3);
              if ((void *)nnode_read == (void *)0x0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,0x75d,"ref_part_metric_solb","malloc metric of REF_DBL NULL");
                ref_node_local._4_4_ = 2;
              }
              else {
                for (ref_private_status_reis_ai_5._4_4_ = 0;
                    SBORROW4(ref_private_status_reis_ai_5._4_4_,metric._4_4_ * 6) !=
                    ref_private_status_reis_ai_5._4_4_ + metric._4_4_ * -6 < 0;
                    ref_private_status_reis_ai_5._4_4_ = ref_private_status_reis_ai_5._4_4_ + 1) {
                  *(undefined8 *)(nnode_read + (long)ref_private_status_reis_ai_5._4_4_ * 8) =
                       0xbff0000000000000;
                }
                for (_node = 0; _node < _ref_private_macro_code_rss_1; _node = local + _node) {
                  if (metric._4_4_ < (int)_ref_private_macro_code_rss_1 - (int)_node) {
                    local_6c4 = metric._4_4_;
                  }
                  else {
                    local_6c4 = (int)_ref_private_macro_code_rss_1 - (int)_node;
                  }
                  local = local_6c4;
                  if (*(int *)(*(long *)(filename_local + 0x50) + 4) == 0) {
                    for (available = 0; available < local; available = available + 1) {
                      if (global._4_4_ == 6) {
                        sVar4 = fread((void *)(nnode_read + (long)(available * 6) * 8),8,1,
                                      pFStack_520);
                        if (sVar4 != 1) {
                          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                 ,0x766,"ref_part_metric_solb","m11",1,sVar4);
                          return 1;
                        }
                        sVar4 = fread((void *)(nnode_read + (long)(available * 6 + 1) * 8),8,1,
                                      pFStack_520);
                        if (sVar4 != 1) {
                          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                 ,0x768,"ref_part_metric_solb","m12",1,sVar4);
                          return 1;
                        }
                        sVar4 = fread((void *)(nnode_read + (long)(available * 6 + 3) * 8),8,1,
                                      pFStack_520);
                        if (sVar4 != 1) {
                          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                 ,0x76b,"ref_part_metric_solb","m22",1,sVar4);
                          return 1;
                        }
                        sVar4 = fread((void *)(nnode_read + (long)(available * 6 + 2) * 8),8,1,
                                      pFStack_520);
                        if (sVar4 != 1) {
                          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                 ,0x76d,"ref_part_metric_solb","m31",1,sVar4);
                          return 1;
                        }
                        sVar4 = fread((void *)(nnode_read + (long)(available * 6 + 4) * 8),8,1,
                                      pFStack_520);
                        if (sVar4 != 1) {
                          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                 ,0x76f,"ref_part_metric_solb","m32",1,sVar4);
                          return 1;
                        }
                        sVar4 = fread((void *)(nnode_read + (long)(available * 6 + 5) * 8),8,1,
                                      pFStack_520);
                        if (sVar4 != 1) {
                          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                 ,0x771,"ref_part_metric_solb","m33",1,sVar4);
                          return 1;
                        }
                      }
                      else {
                        if (global._4_4_ != 3) {
                          printf("%s: %d: %s: %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                 ,0x77d,"ref_part_metric_solb","not a 2D or 3D ldim");
                          return 1;
                        }
                        sVar4 = fread((void *)(nnode_read + (long)(available * 6) * 8),8,1,
                                      pFStack_520);
                        if (sVar4 != 1) {
                          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                 ,0x774,"ref_part_metric_solb","m11",1,sVar4);
                          return 1;
                        }
                        sVar4 = fread((void *)(nnode_read + (long)(available * 6 + 1) * 8),8,1,
                                      pFStack_520);
                        if (sVar4 != 1) {
                          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                 ,0x776,"ref_part_metric_solb","m12",1,sVar4);
                          return 1;
                        }
                        sVar4 = fread((void *)(nnode_read + (long)(available * 6 + 3) * 8),8,1,
                                      pFStack_520);
                        if (sVar4 != 1) {
                          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                 ,0x778,"ref_part_metric_solb","m22",1,sVar4);
                          return 1;
                        }
                        *(undefined8 *)(nnode_read + (long)(available * 6 + 2) * 8) = 0;
                        *(undefined8 *)(nnode_read + (long)(available * 6 + 4) * 8) = 0;
                        *(undefined8 *)(nnode_read + (long)(available * 6 + 5) * 8) =
                             0x3ff0000000000000;
                      }
                    }
                    uVar2 = ref_mpi_bcast(*(REF_MPI *)(filename_local + 0x50),(void *)nnode_read,
                                          metric._4_4_ * 6,3);
                    if (uVar2 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                             ,0x782,"ref_part_metric_solb",(ulong)uVar2,"bcast");
                      return uVar2;
                    }
                  }
                  else {
                    uVar2 = ref_mpi_bcast(*(REF_MPI *)(filename_local + 0x50),(void *)nnode_read,
                                          metric._4_4_ * 6,3);
                    if (uVar2 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                             ,0x786,"ref_part_metric_solb",(ulong)uVar2,"bcast");
                      return uVar2;
                    }
                  }
                  for (available = 0; available < local; available = available + 1) {
                    nnode = available + _node;
                    uVar2 = ::ref_node_local((REF_NODE)filename_local,nnode,&version);
                    if ((uVar2 != 0) && (uVar2 != 5)) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                             ,0x78a,"ref_part_metric_solb",(ulong)uVar2,"local");
                      return uVar2;
                    }
                    if ((version != -1) &&
                       (uVar2 = ref_node_metric_set((REF_NODE)filename_local,version,
                                                    (REF_DBL *)
                                                    (nnode_read + (long)(available * 6) * 8)),
                       uVar2 != 0)) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                             ,0x78d,"ref_part_metric_solb",(ulong)uVar2,"set local node met");
                      return uVar2;
                    }
                    if (type == 2) {
                      nnode = _ref_private_macro_code_rss_1 + available + _node;
                      uVar2 = ::ref_node_local((REF_NODE)filename_local,nnode,&version);
                      if ((uVar2 != 0) && (uVar2 != 5)) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                               ,0x791,"ref_part_metric_solb",(ulong)uVar2,"local");
                        return uVar2;
                      }
                      if ((version != -1) &&
                         (uVar2 = ref_node_metric_set((REF_NODE)filename_local,version,
                                                      (REF_DBL *)
                                                      (nnode_read + (long)(available * 6) * 8)),
                         uVar2 != 0)) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                               ,0x794,"ref_part_metric_solb",(ulong)uVar2,"set local node met");
                        return uVar2;
                      }
                    }
                  }
                }
                if (nnode_read != 0) {
                  free((void *)nnode_read);
                }
                RVar1 = local_30;
                if (*(int *)(next_position + 4) == 0) {
                  _Var5 = ftello(pFStack_520);
                  if (RVar1 != _Var5) {
                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                           ,0x79d,"ref_part_metric_solb","end location",RVar1,_Var5);
                    return 1;
                  }
                  iVar3 = fclose(pFStack_520);
                  if ((long)iVar3 != 0) {
                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                           ,0x79e,"ref_part_metric_solb","close file",0,(long)iVar3);
                    return 1;
                  }
                }
                ref_node_local._4_4_ = 0;
              }
            }
          }
          else {
            if (*(int *)(next_position + 4) == 0) {
              printf("file %ld ref_node %ld %s\n",_ref_private_macro_code_rss_1,
                     *(undefined8 *)(filename_local + 0x68),ref_mpi);
            }
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   0x756,"ref_part_metric_solb","global count mismatch");
            ref_node_local._4_4_ = 1;
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 0x74f,"ref_part_metric_solb",(ulong)uVar2,"bcast ldim");
          ref_node_local._4_4_ = uVar2;
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               0x74d,"ref_part_metric_solb",(ulong)uVar2,"bcast nnode");
        ref_node_local._4_4_ = uVar2;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x74b,
             "ref_part_metric_solb",(ulong)uVar2,"bcast dim");
      ref_node_local._4_4_ = uVar2;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x749,
           "ref_part_metric_solb",(ulong)uVar2,"bcast version");
    ref_node_local._4_4_ = uVar2;
  }
  return ref_node_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_part_metric_solb(REF_NODE ref_node,
                                               const char *filename) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_FILEPOS next_position = REF_EMPTY;
  REF_FILEPOS key_pos[REF_IMPORT_MESHB_LAST_KEYWORD];
  FILE *file;
  REF_INT chunk;
  REF_DBL *metric;
  REF_LONG nnode_read;
  REF_INT section_size;
  REF_INT node, local;
  REF_BOOL available;
  REF_INT version, dim, ntype, type, ldim, i;
  REF_GLOB global;
  REF_LONG nnode;

  file = NULL;
  if (ref_mpi_once(ref_mpi)) {
    RSS(ref_import_meshb_header(filename, &version, key_pos), "header");
    RAS(2 <= version && version <= 4, "unsupported version");
    file = fopen(filename, "r");
    if (NULL == (void *)file) printf("unable to open %s\n", filename);
    RNS(file, "unable to open file");
    RSS(ref_import_meshb_jump(file, version, key_pos, 3, &available,
                              &next_position),
        "jump");
    RAS(available, "solb missing dimension");
    REIS(1, fread((unsigned char *)&dim, 4, 1, file), "dim");
    RAS(2 <= dim && dim <= 3, "unsupported dimension");
    RSS(ref_import_meshb_jump(file, version, key_pos, 62, &available,
                              &next_position),
        "jump");
    RAS(available, "SolAtVertices missing");
    RSS(ref_part_meshb_long(file, version, &nnode), "nnode");
    REIS(1, fread((unsigned char *)&ntype, 4, 1, file), "ntype");
    ldim = 0;
    for (i = 0; i < ntype; i++) {
      REIS(1, fread((unsigned char *)&type, 4, 1, file), "type");
      RAB(1 <= type && type <= 3,
          "only types 1 (scalar) or 3 (tensor)) supported",
          { printf(" %d type\n", type); });
      if (1 == type) ldim += 1;
      if (3 == type) {
        if (2 == dim) {
          ldim += 3;
        } else {
          ldim += 6;
        }
      }
    }
    if (2 == dim) {
      REIS(3, ldim, "2D expects 3 terms of 2x2 metric");
    } else {
      REIS(6, ldim, "3D expects 6 terms of 3x3 metric");
    }
  }
  RSS(ref_mpi_bcast(ref_node_mpi(ref_node), &version, 1, REF_INT_TYPE),
      "bcast version");
  RSS(ref_mpi_bcast(ref_node_mpi(ref_node), &dim, 1, REF_INT_TYPE),
      "bcast dim");
  RSS(ref_mpi_bcast(ref_node_mpi(ref_node), &nnode, 1, REF_GLOB_TYPE),
      "bcast nnode");
  RSS(ref_mpi_bcast(ref_node_mpi(ref_node), &ldim, 1, REF_GLOB_TYPE),
      "bcast ldim");

  if ((nnode != ref_node_n_global(ref_node)) &&
      (nnode / 2 != ref_node_n_global(ref_node))) {
    if (ref_mpi_once(ref_mpi))
      printf("file %ld ref_node " REF_GLOB_FMT " %s\n", nnode,
             ref_node_n_global(ref_node), filename);
    THROW("global count mismatch");
  }

  chunk =
      (REF_INT)MAX(100000, nnode / (REF_LONG)ref_mpi_n(ref_node_mpi(ref_node)));
  chunk = (REF_INT)MIN((REF_LONG)chunk, nnode);

  ref_malloc_init(metric, 6 * chunk, REF_DBL, -1.0);

  nnode_read = 0;
  while (nnode_read < nnode) {
    section_size = MIN(chunk, (REF_INT)(nnode - nnode_read));
    if (ref_mpi_once(ref_node_mpi(ref_node))) {
      for (node = 0; node < section_size; node++) {
        if (6 == ldim) {
          REIS(1, fread(&(metric[0 + 6 * node]), sizeof(REF_DBL), 1, file),
               "m11");
          REIS(1, fread(&(metric[1 + 6 * node]), sizeof(REF_DBL), 1, file),
               "m12");
          /* transposed 3,2 */
          REIS(1, fread(&(metric[3 + 6 * node]), sizeof(REF_DBL), 1, file),
               "m22");
          REIS(1, fread(&(metric[2 + 6 * node]), sizeof(REF_DBL), 1, file),
               "m31");
          REIS(1, fread(&(metric[4 + 6 * node]), sizeof(REF_DBL), 1, file),
               "m32");
          REIS(1, fread(&(metric[5 + 6 * node]), sizeof(REF_DBL), 1, file),
               "m33");
        } else if (3 == ldim) {
          REIS(1, fread(&(metric[0 + 6 * node]), sizeof(REF_DBL), 1, file),
               "m11");
          REIS(1, fread(&(metric[1 + 6 * node]), sizeof(REF_DBL), 1, file),
               "m12");
          REIS(1, fread(&(metric[3 + 6 * node]), sizeof(REF_DBL), 1, file),
               "m22");
          metric[2 + 6 * node] = 0.0; /* m13 */
          metric[4 + 6 * node] = 0.0; /* m23 */
          metric[5 + 6 * node] = 1.0; /* m33 */
        } else {
          THROW("not a 2D or 3D ldim");
        }
      }
      RSS(ref_mpi_bcast(ref_node_mpi(ref_node), metric, 6 * chunk,
                        REF_DBL_TYPE),
          "bcast");
    } else {
      RSS(ref_mpi_bcast(ref_node_mpi(ref_node), metric, 6 * chunk,
                        REF_DBL_TYPE),
          "bcast");
    }
    for (node = 0; node < section_size; node++) {
      global = (REF_LONG)node + nnode_read;
      RXS(ref_node_local(ref_node, global, &local), REF_NOT_FOUND, "local");
      if (REF_EMPTY != local) {
        RSS(ref_node_metric_set(ref_node, local, &(metric[6 * node])),
            "set local node met");
      }
      if (2 == dim) {
        global = nnode + (REF_GLOB)node + nnode_read;
        RXS(ref_node_local(ref_node, global, &local), REF_NOT_FOUND, "local");
        if (REF_EMPTY != local) {
          RSS(ref_node_metric_set(ref_node, local, &(metric[6 * node])),
              "set local node met");
        }
      }
    }
    nnode_read += (REF_LONG)section_size;
  }

  ref_free(metric);
  if (ref_mpi_once(ref_mpi)) {
    REIS(next_position, ftello(file), "end location");
    REIS(0, fclose(file), "close file");
  }

  return REF_SUCCESS;
}